

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O2

void processEvent(SWindowData *window_data,XEvent *event)

{
  int iVar1;
  uint32_t uVar2;
  mfb_key_mod mVar3;
  uint32_t uVar4;
  mfb_mouse_move_func UNRECOVERED_JUMPTABLE_00;
  mfb_active_func UNRECOVERED_JUMPTABLE;
  mfb_mouse_scroll_func UNRECOVERED_JUMPTABLE_01;
  mfb_key key;
  _Bool _Var5;
  mfb_mouse_button_func UNRECOVERED_JUMPTABLE_02;
  mfb_mouse_button mVar6;
  float fVar7;
  float fVar8;
  
  iVar1 = event->type;
  switch(iVar1) {
  case 2:
  case 3:
    if ((ulong)(event->xkey).keycode < 0x100) {
      key = (mfb_key)g_keycodes[(event->xkey).keycode];
    }
    else {
      key = KB_KEY_UNKNOWN;
    }
    uVar4 = translate_mod_ex(key,(event->xcrossing).mode,(uint)(iVar1 == 2));
    window_data->mod_keys = uVar4;
    window_data->key_status[key] = iVar1 == 2;
    if (window_data->keyboard_func != (mfb_keyboard_func)0x0) {
      (*window_data->keyboard_func)((mfb_window *)window_data,key,window_data->mod_keys,iVar1 == 2);
      return;
    }
    break;
  case 4:
  case 5:
    mVar6 = (event->xkey).keycode;
    mVar3 = translate_mod((event->xcrossing).mode);
    window_data->mod_keys = mVar3;
    switch(mVar6) {
    case MOUSE_BTN_1:
    case MOUSE_BTN_2:
    case MOUSE_BTN_3:
      UNRECOVERED_JUMPTABLE_02 = window_data->mouse_btn_func;
      if (UNRECOVERED_JUMPTABLE_02 == (mfb_mouse_button_func)0x0) {
        return;
      }
      goto LAB_00103df3;
    case MOUSE_BTN_4:
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar8 = 1.0;
      break;
    case MOUSE_BTN_5:
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar8 = -1.0;
      break;
    case MOUSE_BTN_6:
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar7 = 1.0;
      goto LAB_00103e2c;
    case MOUSE_BTN_7:
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar7 = -1.0;
LAB_00103e2c:
      fVar8 = 0.0;
      goto LAB_00103e45;
    default:
      UNRECOVERED_JUMPTABLE_02 = window_data->mouse_btn_func;
      if (UNRECOVERED_JUMPTABLE_02 == (mfb_mouse_button_func)0x0) {
        return;
      }
      mVar6 = mVar6 - MOUSE_BTN_4;
LAB_00103df3:
      (*UNRECOVERED_JUMPTABLE_02)((mfb_window *)window_data,mVar6,mVar3,iVar1 == 4);
      return;
    }
    fVar7 = 0.0;
LAB_00103e45:
    (*UNRECOVERED_JUMPTABLE_01)((mfb_window *)window_data,mVar3,fVar7,fVar8);
    return;
  case 6:
    window_data->mouse_pos_x = (event->xkey).x;
    uVar4 = (event->xkey).y;
    window_data->mouse_pos_y = uVar4;
    UNRECOVERED_JUMPTABLE_00 = window_data->mouse_move_func;
    if (UNRECOVERED_JUMPTABLE_00 != (mfb_mouse_move_func)0x0) {
      uVar2 = (event->xkey).x;
LAB_00103d91:
      (*UNRECOVERED_JUMPTABLE_00)((mfb_window *)window_data,uVar2,uVar4);
      return;
    }
    break;
  case 9:
    window_data->is_active = true;
    UNRECOVERED_JUMPTABLE = window_data->active_func;
    if (UNRECOVERED_JUMPTABLE != (mfb_active_func)0x0) {
      _Var5 = true;
LAB_00103dba:
      (*UNRECOVERED_JUMPTABLE)((mfb_window *)window_data,_Var5);
      return;
    }
    break;
  case 10:
    window_data->is_active = false;
    UNRECOVERED_JUMPTABLE = window_data->active_func;
    if (UNRECOVERED_JUMPTABLE != (mfb_active_func)0x0) {
      _Var5 = false;
      goto LAB_00103dba;
    }
    break;
  case 0x11:
    window_data->close = true;
    break;
  case 0x16:
    window_data->window_width = (event->xexpose).count;
    uVar4 = (event->xgraphicsexpose).major_code;
    window_data->window_height = uVar4;
    resize_dst(window_data,(event->xexpose).count,uVar4);
    resize_GL(window_data);
    UNRECOVERED_JUMPTABLE_00 = window_data->resize_func;
    if (UNRECOVERED_JUMPTABLE_00 != (mfb_mouse_move_func)0x0) {
      uVar2 = window_data->window_width;
      uVar4 = window_data->window_height;
      goto LAB_00103d91;
    }
  }
  return;
}

Assistant:

static void 
processEvent(SWindowData *window_data, XEvent *event) {
    switch (event->type) {
        case KeyPress:
        case KeyRelease: 
        {
            mfb_key key_code      = (mfb_key) translate_key(event->xkey.keycode);
            int is_pressed        = (event->type == KeyPress);
            window_data->mod_keys = translate_mod_ex(key_code, event->xkey.state, is_pressed);

            window_data->key_status[key_code] = is_pressed;
            kCall(keyboard_func, key_code, (mfb_key_mod) window_data->mod_keys, is_pressed);
        }
        break;

        case ButtonPress:
        case ButtonRelease:
        {
            mfb_mouse_button button = (mfb_mouse_button) event->xbutton.button;
            int          is_pressed = (event->type == ButtonPress);
            window_data->mod_keys   = translate_mod(event->xkey.state);
            switch (button) {
                case Button1:
                case Button2:
                case Button3:
                    kCall(mouse_btn_func, button, (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;

                case Button4:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, 1.0f);
                    break;
                case Button5:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, -1.0f);
                    break;

                case 6:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 1.0f, 0.0f);
                    break;
                case 7:
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, -1.0f, 0.0f);
                    break;

                default:
                    kCall(mouse_btn_func, (mfb_mouse_button) (button - 4), (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;
            }
        }
        break;

        case MotionNotify:
            window_data->mouse_pos_x = event->xmotion.x;
            window_data->mouse_pos_y = event->xmotion.y;
            kCall(mouse_move_func, event->xmotion.x, event->xmotion.y);
            break;

        case ConfigureNotify: 
        {
            window_data->window_width  = event->xconfigure.width;
            window_data->window_height = event->xconfigure.height;            
            resize_dst(window_data, event->xconfigure.width, event->xconfigure.height);

#if defined(USE_OPENGL_API)
            resize_GL(window_data);
#else
            SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
            if(window_data_x11->image_scaler != 0x0) {
                window_data_x11->image_scaler->data = 0x0;
                XDestroyImage(window_data_x11->image_scaler);
                window_data_x11->image_scaler        = 0x0;
                window_data_x11->image_scaler_width  = 0;
                window_data_x11->image_scaler_height = 0;
            }
            XClearWindow(window_data_x11->display, window_data_x11->window);
#endif                
            kCall(resize_func, window_data->window_width, window_data->window_height);
        }
        break;

        case EnterNotify:
        case LeaveNotify:
        break;

        case FocusIn:
            window_data->is_active = true;
            kCall(active_func, true);
            break;

        case FocusOut:
            window_data->is_active = false;
            kCall(active_func, false);
            break;

        case DestroyNotify:
            window_data->close = true;
            return;
            break;
    }
}